

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int quick_select_int(int *arr,int n)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int t_2;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int t_3;
  int t_1;
  int iVar11;
  
  uVar3 = n - 1;
  iVar2 = (n - ((int)uVar3 >> 0x1f)) + -1 >> 1;
  if (1 < n) {
    iVar4 = 0;
    do {
      uVar10 = iVar4 + 1;
      uVar7 = (ulong)uVar10;
      if (uVar3 == uVar10) {
        iVar5 = arr[iVar4];
        if (arr[(int)uVar3] < iVar5) {
          arr[iVar4] = arr[(int)uVar3];
          arr[(int)uVar3] = iVar5;
        }
        break;
      }
      iVar8 = (int)(iVar4 + uVar3) / 2;
      iVar5 = arr[iVar8];
      iVar11 = arr[(int)uVar3];
      if (iVar11 < iVar5) {
        arr[iVar8] = iVar11;
        arr[(int)uVar3] = iVar5;
        iVar11 = iVar5;
      }
      iVar5 = arr[iVar4];
      if (iVar11 < iVar5) {
        arr[iVar4] = iVar11;
        arr[(int)uVar3] = iVar5;
        iVar5 = arr[iVar4];
      }
      iVar11 = arr[iVar8];
      if (iVar5 < iVar11) {
        arr[iVar8] = iVar5;
        arr[iVar4] = iVar11;
        iVar11 = arr[iVar8];
      }
      arr[iVar8] = arr[(int)uVar10];
      arr[(int)uVar10] = iVar11;
      uVar10 = uVar3;
      while( true ) {
        iVar5 = arr[iVar4];
        uVar7 = (ulong)(int)uVar7;
        do {
          iVar11 = arr[uVar7 + 1];
          uVar7 = uVar7 + 1;
        } while (iVar11 < iVar5);
        lVar1 = (long)(int)uVar10 + 1;
        do {
          uVar9 = uVar10;
          lVar6 = lVar1;
          iVar8 = arr[lVar6 + -2];
          uVar10 = uVar9 - 1;
          lVar1 = lVar6 + -1;
        } while (iVar5 < iVar8);
        if (lVar6 + -1 <= (long)uVar7) break;
        arr[uVar7] = iVar8;
        arr[lVar6 + -2] = iVar11;
      }
      arr[iVar4] = iVar8;
      arr[lVar6 + -2] = iVar5;
      if ((int)uVar10 <= iVar2) {
        iVar4 = (int)uVar7;
      }
      if (iVar2 < (int)uVar9) {
        uVar3 = uVar9 - 2;
      }
    } while (iVar4 < (int)uVar3);
  }
  return arr[iVar2];
}

Assistant:

static int quick_select_int(int arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}